

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_tiff_file(image *this,string *filename)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Exception *pEVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint32 row;
  ulong uVar5;
  ulong uVar6;
  Ptr PVar7;
  string local_68;
  image *local_48;
  int local_40;
  uint local_3c;
  uint32 width;
  uint32 height;
  uint16 channels;
  uint16 bits;
  
  TIFFSetWarningHandler(0);
  TIFFSetErrorHandler(tiff_error_handler);
  lVar2 = TIFFOpen((filename->_M_dataplus)._M_p,"r");
  if (lVar2 == 0) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_68,"TIFF file format not recognized",(allocator *)&local_40);
    util::Exception::Exception(pEVar4,&local_68);
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  TIFFGetField(lVar2,0x100,&local_40);
  TIFFGetField(lVar2,0x101,&local_3c);
  TIFFGetField(lVar2,0x115,&height);
  TIFFGetField(lVar2,0x102,(long)&height + 2);
  if (height._2_2_ == 8) {
    Image<unsigned_char>::create
              ((Image<unsigned_char> *)this,local_40,local_3c,(uint)(ushort)height);
    local_48 = this;
    lVar3 = TIFFScanlineSize(lVar2);
    lVar1 = *(long *)this;
    uVar6 = 0;
    for (uVar5 = 0; uVar5 < local_3c; uVar5 = uVar5 + 1) {
      TIFFReadScanline(lVar2,(uVar6 & 0xffffffff) + *(long *)(lVar1 + 0x18),uVar5 & 0xffffffff,0);
      uVar6 = uVar6 + lVar3;
    }
    TIFFClose(lVar2);
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    return (Ptr)PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_68,"Expected 8 bit TIFF file",(allocator *)((long)&width + 3));
  util::Exception::Exception(pEVar4,&local_68);
  __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_tiff_file (std::string const& filename)
{
    TIFFSetWarningHandler(nullptr);
    TIFFSetErrorHandler(tiff_error_handler);

    TIFF* tif = TIFFOpen(filename.c_str(), "r");
    if (!tif)
        throw util::Exception("TIFF file format not recognized");

    try
    {
        /* Read width and height from TIFF and create MVE image. */
        uint32 width, height;
        uint16 channels, bits;
        TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &width);
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &height);
        TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &channels);
        TIFFGetField(tif, TIFFTAG_BITSPERSAMPLE, &bits);
        if (bits != 8)
            throw util::Exception("Expected 8 bit TIFF file");
        ByteImage::Ptr image = ByteImage::create(width, height, channels);

        /* Scanline based TIFF reading. */
        uint32 rowstride = TIFFScanlineSize(tif);
        ByteImage::ImageData& data = image->get_data();
        for (uint32 row = 0; row < height; row++)
        {
            tdata_t row_pointer = &data[row * rowstride];
            TIFFReadScanline(tif, row_pointer, row);
        }

        TIFFClose(tif);
        return image;
    }
    catch (std::exception& e)
    {
        TIFFClose(tif);
        throw;
    }
}